

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTextUsage.cpp
# Opt level: O0

EStatusCode RunCFFTest(char **argv,bool inEmbedFonts)

{
  undefined1 uVar1;
  EStatusCode EVar2;
  char *__s;
  EncryptionOptions *pEVar3;
  PDFPage *this;
  PDFUsedFont *pPVar4;
  allocator<char> local_1169;
  string local_1168;
  allocator<char> local_1141;
  string local_1140;
  string local_1120;
  PDFUsedFont *local_1100;
  PDFUsedFont *fontK;
  string local_10f0;
  EStatusCode local_10d0;
  allocator<char> local_10c9;
  EStatusCode encodingStatus;
  string local_10a8;
  PDFUsedFont *local_1088;
  PDFUsedFont *font;
  PageContentContext *contentContext;
  PDFPage *local_1058;
  PDFPage *page;
  PDFCreationSettings local_1000;
  allocator<char> local_f99;
  string local_f98;
  string local_f78;
  LogConfiguration local_f58;
  allocator<char> local_f11;
  string local_f10;
  string local_ef0;
  EStatusCode local_ecc;
  undefined1 local_ec8 [4];
  EStatusCode status;
  PDFWriter pdfWriter;
  bool inEmbedFonts_local;
  char **argv_local;
  
  pdfWriter._3759_1_ = inEmbedFonts;
  PDFWriter::PDFWriter((PDFWriter *)local_ec8);
  __s = "SimpleTextUsageCFFNoEmbed.pdf";
  if ((pdfWriter._3759_1_ & 1) != 0) {
    __s = "SimpleTextUsageCFF.pdf";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f10,__s,&local_f11);
  BuildRelativeOutputPath(&local_ef0,argv,&local_f10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f98,"SimpleTextUsage.log",&local_f99);
  BuildRelativeOutputPath(&local_f78,argv,&local_f98);
  LogConfiguration::LogConfiguration(&local_f58,true,true,&local_f78);
  uVar1 = pdfWriter._3759_1_;
  pEVar3 = EncryptionOptions::DefaultEncryptionOptions();
  EncryptionOptions::EncryptionOptions((EncryptionOptions *)&page,pEVar3);
  PDFCreationSettings::PDFCreationSettings
            (&local_1000,true,(bool)(uVar1 & 1),(EncryptionOptions *)&page,false);
  local_ecc = PDFWriter::StartPDF((PDFWriter *)local_ec8,&local_ef0,ePDFVersion13,&local_f58,
                                  &local_1000);
  PDFCreationSettings::~PDFCreationSettings(&local_1000);
  EncryptionOptions::~EncryptionOptions((EncryptionOptions *)&page);
  LogConfiguration::~LogConfiguration(&local_f58);
  std::__cxx11::string::~string((string *)&local_f78);
  std::__cxx11::string::~string((string *)&local_f98);
  std::allocator<char>::~allocator(&local_f99);
  std::__cxx11::string::~string((string *)&local_ef0);
  std::__cxx11::string::~string((string *)&local_f10);
  std::allocator<char>::~allocator(&local_f11);
  if (local_ecc == eSuccess) {
    this = (PDFPage *)operator_new(0x2b8);
    PDFPage::PDFPage(this);
    local_1058 = this;
    PDFRectangle::PDFRectangle((PDFRectangle *)&contentContext,0.0,0.0,595.0,842.0);
    PDFPage::SetMediaBox(this,(PDFRectangle *)&contentContext);
    PDFRectangle::~PDFRectangle((PDFRectangle *)&contentContext);
    font = (PDFUsedFont *)PDFWriter::StartPageContentContext((PDFWriter *)local_ec8,local_1058);
    if (font == (PDFUsedFont *)0x0) {
      local_ecc = eFailure;
      std::operator<<((ostream *)&std::cout,"failed to create content context for page\n");
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&encodingStatus,"fonts/BrushScriptStd.otf",&local_10c9);
      BuildRelativeInputPath(&local_10a8,argv,(string *)&encodingStatus);
      pPVar4 = PDFWriter::GetFontForFile((PDFWriter *)local_ec8,&local_10a8,0);
      std::__cxx11::string::~string((string *)&local_10a8);
      std::__cxx11::string::~string((string *)&encodingStatus);
      std::allocator<char>::~allocator(&local_10c9);
      local_1088 = pPVar4;
      if (pPVar4 == (PDFUsedFont *)0x0) {
        local_ecc = eFailure;
        std::operator<<((ostream *)&std::cout,
                        "Failed to create font object for brushscriptstd.otf\n");
      }
      else {
        AbstractContentContext::BT((AbstractContentContext *)font);
        AbstractContentContext::k((AbstractContentContext *)font,0.0,0.0,0.0,1.0);
        AbstractContentContext::Tf((AbstractContentContext *)font,local_1088,1.0);
        AbstractContentContext::Tm
                  ((AbstractContentContext *)font,30.0,0.0,0.0,30.0,78.4252,662.8997);
        pPVar4 = font;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_10f0,"abcd",(allocator<char> *)((long)&fontK + 7));
        EVar2 = AbstractContentContext::Tj((AbstractContentContext *)pPVar4,&local_10f0);
        std::__cxx11::string::~string((string *)&local_10f0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&fontK + 7));
        local_10d0 = EVar2;
        if (EVar2 != eSuccess) {
          std::operator<<((ostream *)&std::cout,
                          "Could not find some of the glyphs for this font (BrushScriptStd)");
        }
        AbstractContentContext::ET((AbstractContentContext *)font);
        AbstractContentContext::BT((AbstractContentContext *)font);
        AbstractContentContext::k((AbstractContentContext *)font,0.0,0.0,0.0,1.0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1140,"fonts/KozGoPro-Regular.otf",&local_1141);
        BuildRelativeInputPath(&local_1120,argv,&local_1140);
        pPVar4 = PDFWriter::GetFontForFile((PDFWriter *)local_ec8,&local_1120,0);
        std::__cxx11::string::~string((string *)&local_1120);
        std::__cxx11::string::~string((string *)&local_1140);
        std::allocator<char>::~allocator(&local_1141);
        local_1100 = pPVar4;
        if (pPVar4 == (PDFUsedFont *)0x0) {
          local_ecc = eFailure;
          std::operator<<((ostream *)&std::cout,
                          "Failed to create font object for KozGoPro-Regular.otf\n");
        }
        else {
          AbstractContentContext::Tf((AbstractContentContext *)font,pPVar4,1.0);
          AbstractContentContext::Tm
                    ((AbstractContentContext *)font,30.0,0.0,0.0,30.0,78.4252,400.8997);
          pPVar4 = font;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1168,"abcd",&local_1169);
          local_10d0 = AbstractContentContext::Tj((AbstractContentContext *)pPVar4,&local_1168);
          std::__cxx11::string::~string((string *)&local_1168);
          std::allocator<char>::~allocator(&local_1169);
          if (local_10d0 != eSuccess) {
            std::operator<<((ostream *)&std::cout,
                            "Could not find some of the glyphs for this font (Kozuka)");
          }
          AbstractContentContext::ET((AbstractContentContext *)font);
          local_ecc = PDFWriter::EndPageContentContext
                                ((PDFWriter *)local_ec8,(PageContentContext *)font);
          if (local_ecc == eSuccess) {
            local_ecc = PDFWriter::WritePageAndRelease((PDFWriter *)local_ec8,local_1058);
            if (local_ecc == eSuccess) {
              local_ecc = PDFWriter::EndPDF((PDFWriter *)local_ec8);
              if (local_ecc != eSuccess) {
                std::operator<<((ostream *)&std::cout,"failed in end PDF\n");
              }
            }
            else {
              std::operator<<((ostream *)&std::cout,"failed to write page\n");
            }
          }
          else {
            std::operator<<((ostream *)&std::cout,"failed to end page content context\n");
          }
        }
      }
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,"failed to start PDF\n");
  }
  EVar2 = local_ecc;
  PDFWriter::~PDFWriter((PDFWriter *)local_ec8);
  return EVar2;
}

Assistant:

static EStatusCode RunCFFTest(char* argv[],bool inEmbedFonts)
{
	PDFWriter pdfWriter;
	EStatusCode status; 

	do
	{
		status = pdfWriter.StartPDF(BuildRelativeOutputPath(argv, inEmbedFonts ? "SimpleTextUsageCFF.pdf" : "SimpleTextUsageCFFNoEmbed.pdf"),
                                    ePDFVersion13,
                                    LogConfiguration(true,true,
                                                     BuildRelativeOutputPath(argv,"SimpleTextUsage.log")),
													 PDFCreationSettings(true, inEmbedFonts));
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to start PDF\n";
			break;
		}	

		PDFPage* page = new PDFPage();
		page->SetMediaBox(PDFRectangle(0,0,595,842));

		PageContentContext* contentContext = pdfWriter.StartPageContentContext(page);
		if(NULL == contentContext)
		{
			status = PDFHummus::eFailure;
			cout<<"failed to create content context for page\n";
			break;
		}

		PDFUsedFont* font = pdfWriter.GetFontForFile(
                                                     BuildRelativeInputPath(
                                                                            argv,
                                                                            "fonts/BrushScriptStd.otf"));
		if(!font)
		{
			status = PDFHummus::eFailure;
			cout<<"Failed to create font object for brushscriptstd.otf\n";
			break;
		}

		// Draw some text
		contentContext->BT();
		contentContext->k(0,0,0,1);

		contentContext->Tf(font,1);

		contentContext->Tm(30,0,0,30,78.4252,662.8997);

		EStatusCode encodingStatus = contentContext->Tj("abcd");
		if(encodingStatus != PDFHummus::eSuccess)
			cout<<"Could not find some of the glyphs for this font (BrushScriptStd)";

		// continue even if failed...want to see how it looks like
		contentContext->ET();

		// now write some more text with kozuka font
		contentContext->BT();
		contentContext->k(0,0,0,1);

		PDFUsedFont* fontK = pdfWriter.GetFontForFile(
                                                      BuildRelativeInputPath(
                                                                             argv,
                                                                             "fonts/KozGoPro-Regular.otf"));
		if(!fontK)
		{
			status = PDFHummus::eFailure;
			cout<<"Failed to create font object for KozGoPro-Regular.otf\n";
			break;
		}

		contentContext->Tf(fontK,1);

		contentContext->Tm(30,0,0,30,78.4252,400.8997);

		encodingStatus = contentContext->Tj("abcd");
		if(encodingStatus != PDFHummus::eSuccess)
			cout<<"Could not find some of the glyphs for this font (Kozuka)";

		// continue even if failed...want to see how it looks like
		contentContext->ET();

		status = pdfWriter.EndPageContentContext(contentContext);
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to end page content context\n";
			break;
		}

		status = pdfWriter.WritePageAndRelease(page);
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to write page\n";
			break;
		}

		status = pdfWriter.EndPDF();
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed in end PDF\n";
			break;
		}
	}while(false);
	return status;	

}